

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O2

void __thiscall
QStandardItemModelPrivate::columnsRemoved
          (QStandardItemModelPrivate *this,QStandardItem *parent,int column,int count)

{
  QStandardItem *pQVar1;
  char *pcVar2;
  
  if ((this->root).d == parent) {
    for (pcVar2 = (char *)(long)column; (long)pcVar2 < (long)(count + column); pcVar2 = pcVar2 + 1)
    {
      pQVar1 = (this->columnHeaderItems).d.ptr[(long)pcVar2];
      if (pQVar1 != (QStandardItem *)0x0) {
        QStandardItemPrivate::setModel((pQVar1->d_ptr).d,(QStandardItemModel *)0x0);
        (*pQVar1->_vptr_QStandardItem[1])(pQVar1);
      }
    }
    QList<QStandardItem_*>::remove(&this->columnHeaderItems,(char *)(long)column);
  }
  QAbstractItemModel::endRemoveColumns();
  return;
}

Assistant:

void QStandardItemModelPrivate::columnsRemoved(QStandardItem *parent,
                                               int column, int count)
{
    Q_Q(QStandardItemModel);
    if (parent == root.data()) {
        for (int i = column; i < column + count; ++i) {
            QStandardItem *oldItem = columnHeaderItems.at(i);
            if (oldItem)
                oldItem->d_func()->setModel(nullptr);
            delete oldItem;
        }
        columnHeaderItems.remove(column, count);
    }
    q->endRemoveColumns();
}